

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::SetAlias
          (MicroString *this,string_view data,Arena *arena,size_t inline_capacity)

{
  LargeRepKind LVar1;
  LargeRep *pLVar2;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal LStack_38;
  
  if ((((ulong)this->rep_ & 1) != 0) && (LVar1 = large_rep_kind(this), LVar1 == kAlias)) {
    pLVar2 = large_rep(this);
    pLVar2->payload = data._M_str;
    pLVar2->size = (uint32_t)data._M_len;
    return;
  }
  if (data._M_len <= inline_capacity) {
    SetImpl(this,data,arena,inline_capacity);
    return;
  }
  if ((((ulong)this->rep_ & 1) == 0) || (LVar1 = large_rep_kind(this), LVar1 != kAlias)) {
    if (arena == (Arena *)0x0) {
      Destroy(this);
    }
    pLVar2 = Arena::Create<google::protobuf::internal::MicroString::LargeRep>(arena);
    pLVar2->capacity = 0;
    this->rep_ = (void *)((ulong)pLVar2 | 1);
  }
  else {
    pLVar2 = large_rep(this);
  }
  pLVar2->payload = data._M_str;
  pLVar2->size = (uint32_t)data._M_len;
  LVar1 = large_rep_kind(this);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (LVar1,0,"+large_rep_kind() == +kAlias");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,0x104,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

void MicroString::SetAlias(absl::string_view data, Arena* arena,
                           size_t inline_capacity) {
  // If we already have an alias, reuse the block.
  if (is_large_rep() && large_rep_kind() == kAlias) {
    auto* h = large_rep();
    h->SetExternalBuffer(data);
    return;
  }
  // If we can fit in the inline rep, avoid allocating memory.
  if (data.size() <= inline_capacity) {
    return Set(data, arena, inline_capacity);
  }

  LargeRep* h;
  if (!is_large_rep() || large_rep_kind() != kAlias) {
    if (arena == nullptr) {
      Destroy();
    }

    h = Arena::Create<LargeRep>(arena);
    h->capacity = kAlias;
    rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) |
                                   kIsLargeRepTag);
  } else {
    h = large_rep();
  }
  h->SetExternalBuffer(data);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kAlias);
}